

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_PNGFilter.cc
# Opt level: O3

void __thiscall Pl_PNGFilter::encodeRow(Pl_PNGFilter *this)

{
  Pipeline *pPVar1;
  ulong uVar2;
  uchar ch;
  char local_19;
  
  local_19 = '\x02';
  pPVar1 = (this->super_Pipeline).next_;
  (*pPVar1->_vptr_Pipeline[2])(pPVar1,&local_19,1);
  if (this->prev_row == (uchar *)0x0) {
    pPVar1 = (this->super_Pipeline).next_;
    (*pPVar1->_vptr_Pipeline[2])(pPVar1,this->cur_row,(ulong)this->bytes_per_row);
  }
  else if (this->bytes_per_row != 0) {
    uVar2 = 0;
    do {
      local_19 = this->cur_row[uVar2] - this->prev_row[uVar2];
      pPVar1 = (this->super_Pipeline).next_;
      (*pPVar1->_vptr_Pipeline[2])(pPVar1,&local_19,1);
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->bytes_per_row);
  }
  return;
}

Assistant:

void
Pl_PNGFilter::encodeRow()
{
    // For now, hard-code to using UP filter.
    unsigned char ch = 2;
    next()->write(&ch, 1);
    if (this->prev_row) {
        for (unsigned int i = 0; i < this->bytes_per_row; ++i) {
            ch = static_cast<unsigned char>(this->cur_row[i] - this->prev_row[i]);
            next()->write(&ch, 1);
        }
    } else {
        next()->write(this->cur_row, this->bytes_per_row);
    }
}